

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  byte bVar1;
  int iVar2;
  stbi_uc *psVar3;
  byte *pbVar4;
  char *pcVar5;
  stbi_uc *psVar6;
  byte *pbVar7;
  uint uVar8;
  long in_FS_OFFSET;
  
  psVar6 = s->img_buffer;
  if (psVar6 < s->img_buffer_end) {
LAB_002d500c:
    psVar3 = psVar6 + 1;
    s->img_buffer = psVar3;
    if (*psVar6 == 'G') {
      if (s->img_buffer_end <= psVar3) {
        if (s->read_from_callbacks == 0) goto LAB_002d5233;
        stbi__refill_buffer(s);
        psVar3 = s->img_buffer;
      }
      psVar6 = psVar3 + 1;
      s->img_buffer = psVar6;
      if (*psVar3 == 'I') {
        if (s->img_buffer_end <= psVar6) {
          if (s->read_from_callbacks == 0) goto LAB_002d5233;
          stbi__refill_buffer(s);
          psVar6 = s->img_buffer;
        }
        psVar3 = psVar6 + 1;
        s->img_buffer = psVar3;
        if (*psVar6 == 'F') {
          if (s->img_buffer_end <= psVar3) {
            if (s->read_from_callbacks == 0) goto LAB_002d5233;
            stbi__refill_buffer(s);
            psVar3 = s->img_buffer;
          }
          psVar6 = psVar3 + 1;
          s->img_buffer = psVar6;
          if (*psVar3 == '8') {
            if (s->img_buffer_end <= psVar6) {
              if (s->read_from_callbacks == 0) goto LAB_002d5233;
              stbi__refill_buffer(s);
              psVar6 = s->img_buffer;
            }
            psVar3 = psVar6 + 1;
            s->img_buffer = psVar3;
            if ((*psVar6 == '7') || (*psVar6 == '9')) {
              if (s->img_buffer_end <= psVar3) {
                if (s->read_from_callbacks == 0) goto LAB_002d5233;
                stbi__refill_buffer(s);
                psVar3 = s->img_buffer;
              }
              s->img_buffer = psVar3 + 1;
              if (*psVar3 == 'a') {
                *(char **)(in_FS_OFFSET + -0x3a8) = "";
                iVar2 = stbi__get16le(s);
                g->w = iVar2;
                iVar2 = stbi__get16le(s);
                g->h = iVar2;
                pbVar4 = s->img_buffer;
                pbVar7 = s->img_buffer_end;
                if (pbVar4 < pbVar7) {
LAB_002d5194:
                  s->img_buffer = pbVar4 + 1;
                  uVar8 = (uint)*pbVar4;
                  pbVar4 = pbVar4 + 1;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar4 = s->img_buffer;
                    pbVar7 = s->img_buffer_end;
                    goto LAB_002d5194;
                  }
                  uVar8 = 0;
                }
                g->flags = uVar8;
                if (pbVar4 < pbVar7) {
LAB_002d51ce:
                  s->img_buffer = pbVar4 + 1;
                  uVar8 = (uint)*pbVar4;
                  pbVar4 = pbVar4 + 1;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar4 = s->img_buffer;
                    pbVar7 = s->img_buffer_end;
                    goto LAB_002d51ce;
                  }
                  uVar8 = 0;
                }
                g->bgindex = uVar8;
                if (pbVar4 < pbVar7) {
LAB_002d5201:
                  s->img_buffer = pbVar4 + 1;
                  uVar8 = (uint)*pbVar4;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar4 = s->img_buffer;
                    goto LAB_002d5201;
                  }
                  uVar8 = 0;
                }
                g->ratio = uVar8;
                g->transparent = -1;
                if ((g->w < 0x1000001) && (g->h < 0x1000001)) {
                  if (comp != (int *)0x0) {
                    *comp = 4;
                  }
                  if (is_info != 0) {
                    return 1;
                  }
                  bVar1 = (byte)g->flags;
                  if (-1 < (char)bVar1) {
                    return 1;
                  }
                  stbi__gif_parse_colortable(s,g->pal,2 << (bVar1 & 7),-1);
                  return 1;
                }
                pcVar5 = "too large";
                goto LAB_002d523a;
              }
            }
          }
        }
      }
    }
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    psVar6 = s->img_buffer;
    goto LAB_002d500c;
  }
LAB_002d5233:
  pcVar5 = "not GIF";
LAB_002d523a:
  *(char **)(in_FS_OFFSET + -0x3a8) = pcVar5;
  return 0;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (g->w > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (g->h > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}